

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O1

void __thiscall
zmq::socks_connecter_t::socks_connecter_t
          (socks_connecter_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,address_t *proxy_addr_,bool delayed_start_)

{
  int iVar1;
  
  stream_connecter_base_t::stream_connecter_base_t
            (&this->super_stream_connecter_base_t,io_thread_,session_,options_,addr_,delayed_start_)
  ;
  (this->super_stream_connecter_base_t).super_own_t.super_object_t._vptr_object_t =
       (_func_int **)&PTR__socks_connecter_t_00269540;
  (this->super_stream_connecter_base_t).super_io_object_t.super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__socks_connecter_t_00269638;
  socks_greeting_encoder_t::socks_greeting_encoder_t(&this->_greeting_encoder);
  socks_choice_decoder_t::socks_choice_decoder_t(&this->_choice_decoder);
  socks_basic_auth_request_encoder_t::socks_basic_auth_request_encoder_t
            (&this->_basic_auth_request_encoder);
  socks_auth_response_decoder_t::socks_auth_response_decoder_t(&this->_auth_response_decoder);
  socks_request_encoder_t::socks_request_encoder_t(&this->_request_encoder);
  socks_response_decoder_t::socks_response_decoder_t(&this->_response_decoder);
  this->_proxy_addr = proxy_addr_;
  this->_auth_method = 0;
  (this->_auth_username)._M_dataplus._M_p = (pointer)&(this->_auth_username).field_2;
  (this->_auth_username)._M_string_length = 0;
  (this->_auth_username).field_2._M_local_buf[0] = '\0';
  (this->_auth_password)._M_dataplus._M_p = (pointer)&(this->_auth_password).field_2;
  (this->_auth_password)._M_string_length = 0;
  (this->_auth_password).field_2._M_local_buf[0] = '\0';
  this->_status = 0;
  iVar1 = std::__cxx11::string::compare((char *)(this->super_stream_connecter_base_t)._addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->protocol == protocol_name::tcp",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
            ,0x42);
    fflush(_stderr);
    zmq_abort("_addr->protocol == protocol_name::tcp");
  }
  address_t::to_string(this->_proxy_addr,&(this->super_stream_connecter_base_t)._endpoint);
  return;
}

Assistant:

zmq::socks_connecter_t::socks_connecter_t (class io_thread_t *io_thread_,
                                           class session_base_t *session_,
                                           const options_t &options_,
                                           address_t *addr_,
                                           address_t *proxy_addr_,
                                           bool delayed_start_) :
    stream_connecter_base_t (
      io_thread_, session_, options_, addr_, delayed_start_),
    _proxy_addr (proxy_addr_),
    _auth_method (socks_no_auth_required),
    _status (unplugged)
{
    zmq_assert (_addr->protocol == protocol_name::tcp);
    _proxy_addr->to_string (_endpoint);
}